

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string_type local_40;
  long local_20;
  size_type pos;
  path *this_local;
  
  pos = (size_type)this;
  this_local = __return_storage_ptr__;
  uVar2 = std::__cxx11::string::length();
  if ((((2 < uVar2) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 == '/')) &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 == '/')) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 != '/')) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    iVar1 = isprint((int)*pcVar3);
    if (iVar1 != 0) {
      local_20 = std::__cxx11::string::find_first_of((char *)this,0x226cad);
      if (local_20 == -1) {
        path<std::__cxx11::string,ghc::filesystem::path>
                  (__return_storage_ptr__,&this->_path,auto_format);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
      path(__return_storage_ptr__,&local_40,auto_format);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
  }
  path(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_name() const
{
#ifdef GHC_OS_WINDOWS
    if (_path.length() >= 2 && std::toupper(static_cast<unsigned char>(_path[0])) >= 'A' && std::toupper(static_cast<unsigned char>(_path[0])) <= 'Z' && _path[1] == ':') {
        return path(_path.substr(0, 2));
    }
#endif
    if (_path.length() > 2 && _path[0] == '/' && _path[1] == '/' && _path[2] != '/' && std::isprint(_path[2])) {
        impl_string_type::size_type pos = _path.find_first_of("/\\", 3);
        if (pos == impl_string_type::npos) {
            return path(_path);
        }
        else {
            return path(_path.substr(0, pos));
        }
    }
    return path();
}